

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O0

int __thiscall ncnn::LayerNorm::forward_inplace(LayerNorm *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RSI;
  long in_RDI;
  float fVar1;
  double dVar2;
  float fVar3;
  int i_9;
  int i_8;
  float b_3;
  float a_3;
  float var_3;
  int i_7;
  float tmp_3;
  float mean_3;
  int i_6;
  float sqsum_3;
  float sum_3;
  float *ptr_3;
  int q_1;
  int j_7;
  int j_6;
  float b_2;
  float a_2;
  float var_2;
  int j_5;
  float tmp_2;
  float mean_2;
  int j_4;
  float sqsum_2;
  float sum_2;
  float *ptr_2;
  int i_5;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_3;
  int j_2;
  float b_1;
  float a_1;
  float var_1;
  int j_1;
  float tmp_1;
  float mean_1;
  int j;
  float sqsum_1;
  float sum_1;
  float *ptr_1;
  int i_4;
  int h;
  int w_1;
  int i_3;
  int i_2;
  float b;
  float a;
  float var;
  int i_1;
  float tmp;
  float mean;
  int i;
  float sqsum;
  float sum;
  float *ptr;
  int w;
  int dims;
  Mat *m_1;
  Mat *m;
  int local_3ec;
  int local_3e8;
  int local_3d8;
  int local_3cc;
  float local_3c8;
  float local_3c4;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  long local_378;
  int local_36c;
  int local_368;
  int local_364;
  float local_360;
  float local_35c;
  float local_358;
  int local_354;
  float local_350;
  float local_34c;
  int local_348;
  float local_344;
  float local_340;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined4 local_318;
  long local_310;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  float local_2bc;
  float local_2b8;
  float local_2b4;
  int local_2b0;
  float local_2ac;
  float local_2a8;
  int local_2a4;
  float local_2a0;
  float local_29c;
  long local_298;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  float local_27c;
  float local_278;
  float local_274;
  int local_270;
  float local_26c;
  float local_268;
  int local_264;
  float local_260;
  float local_25c;
  long local_258;
  int local_250;
  int local_24c;
  long *local_240;
  undefined8 *local_230;
  undefined8 *local_220;
  undefined8 *local_210;
  long local_200;
  long *local_1f8;
  long local_1f0;
  long *local_1e8;
  long local_1e0;
  long *local_1d8;
  long local_1d0;
  long *local_1c8;
  long local_1c0;
  long *local_1b8;
  long local_1b0;
  long *local_1a8;
  long local_1a0;
  long *local_198;
  long local_190;
  long *local_188;
  int local_17c;
  undefined8 *local_178;
  int local_16c;
  long *local_168;
  undefined1 local_15d;
  int local_15c;
  undefined8 *local_150;
  undefined1 local_13d;
  int local_13c;
  undefined8 *local_130;
  undefined8 *local_e8;
  undefined8 *local_c8;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_24c = (int)in_RSI[5];
  local_240 = in_RSI;
  if (local_24c == 1) {
    local_250 = *(int *)((long)in_RSI + 0x2c);
    local_258 = *in_RSI;
    local_25c = 0.0;
    local_260 = 0.0;
    for (local_264 = 0; local_264 < local_250; local_264 = local_264 + 1) {
      local_25c = *(float *)(local_258 + (long)local_264 * 4) + local_25c;
    }
    local_268 = local_25c / (float)local_250;
    local_26c = 0.0;
    for (local_270 = 0; local_270 < local_250; local_270 = local_270 + 1) {
      local_26c = *(float *)(local_258 + (long)local_270 * 4) - local_268;
      local_260 = local_26c * local_26c + local_260;
    }
    local_274 = local_260 / (float)local_250;
    dVar2 = std::sqrt((double)(ulong)(uint)(local_274 + *(float *)(in_RDI + 0xd4)));
    local_278 = 1.0 / SUB84(dVar2,0);
    local_27c = -local_268 * local_278;
    if (*(int *)(in_RDI + 0xd8) == 0) {
      for (local_284 = 0; local_284 < local_250; local_284 = local_284 + 1) {
        *(float *)(local_258 + (long)local_284 * 4) =
             *(float *)(local_258 + (long)local_284 * 4) * local_278 + local_27c;
      }
    }
    else {
      for (local_280 = 0; local_280 < local_250; local_280 = local_280 + 1) {
        local_188 = (long *)(in_RDI + 0xe0);
        local_190 = (long)local_280;
        local_198 = (long *)(in_RDI + 0x128);
        local_1a0 = (long)local_280;
        *(float *)(local_258 + (long)local_280 * 4) =
             (*(float *)(local_258 + (long)local_280 * 4) * local_278 + local_27c) *
             *(float *)(*local_188 + local_190 * 4) + *(float *)(*local_198 + local_1a0 * 4);
      }
    }
  }
  if (local_24c == 2) {
    local_288 = *(int *)((long)local_240 + 0x2c);
    local_28c = (int)local_240[6];
    for (local_290 = 0; local_290 < local_28c; local_290 = local_290 + 1) {
      local_168 = local_240;
      local_16c = local_290;
      local_298 = *local_240 +
                  (long)*(int *)((long)local_240 + 0x2c) * (long)local_290 * local_240[2];
      local_29c = 0.0;
      local_2a0 = 0.0;
      for (local_2a4 = 0; local_2a4 < local_288; local_2a4 = local_2a4 + 1) {
        local_29c = *(float *)(local_298 + (long)local_2a4 * 4) + local_29c;
      }
      local_2a8 = local_29c / (float)local_288;
      local_2ac = 0.0;
      for (local_2b0 = 0; local_2b0 < local_288; local_2b0 = local_2b0 + 1) {
        local_2ac = *(float *)(local_298 + (long)local_2b0 * 4) - local_2a8;
        local_2a0 = local_2ac * local_2ac + local_2a0;
      }
      local_2b4 = local_2a0 / (float)local_288;
      dVar2 = std::sqrt((double)(ulong)(uint)(local_2b4 + *(float *)(in_RDI + 0xd4)));
      local_2b8 = 1.0 / SUB84(dVar2,0);
      local_2bc = -local_2a8 * local_2b8;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_2c4 = 0; local_2c4 < local_288; local_2c4 = local_2c4 + 1) {
          *(float *)(local_298 + (long)local_2c4 * 4) =
               *(float *)(local_298 + (long)local_2c4 * 4) * local_2b8 + local_2bc;
        }
      }
      else {
        for (local_2c0 = 0; local_2c0 < local_288; local_2c0 = local_2c0 + 1) {
          local_1a8 = (long *)(in_RDI + 0xe0);
          local_1b0 = (long)local_2c0;
          local_1b8 = (long *)(in_RDI + 0x128);
          local_1c0 = (long)local_2c0;
          *(float *)(local_298 + (long)local_2c0 * 4) =
               (*(float *)(local_298 + (long)local_2c0 * 4) * local_2b8 + local_2bc) *
               *(float *)(*local_1a8 + local_1b0 * 4) + *(float *)(*local_1b8 + local_1c0 * 4);
        }
      }
    }
  }
  if (local_24c == 3) {
    local_2c8 = *(int *)((long)local_240 + 0x2c);
    local_2cc = (int)local_240[6];
    local_2d0 = (int)local_240[7];
    local_2d4 = local_2c8 * local_2cc;
    if (*(int *)(in_RDI + 0xd0) == local_2c8) {
      for (local_2d8 = 0; local_2d8 < local_2d0; local_2d8 = local_2d8 + 1) {
        for (local_2dc = 0; local_2dc < local_2cc; local_2dc = local_2dc + 1) {
          local_130 = &local_330;
          local_64 = *(int *)((long)local_240 + 0x2c);
          local_68 = (int)local_240[6];
          local_6c = *(undefined4 *)((long)local_240 + 0x34);
          local_78 = *local_240 + local_240[8] * (long)local_2d8 * local_240[2];
          local_80 = local_240[2];
          local_84 = (undefined4)local_240[3];
          local_90 = local_240[4];
          local_60 = &local_330;
          local_8 = (long)local_64 * (long)local_68 * local_80;
          local_178 = &local_330;
          local_2e8 = local_78 + (long)local_64 * (long)local_2dc * local_80;
          local_230 = &local_330;
          local_c = 0x10;
          local_13c = local_2d8;
          local_13d = 1;
          local_17c = local_2dc;
          local_330 = 0;
          local_320 = 0;
          local_318 = 0;
          local_308 = 0;
          local_304 = 0;
          local_300 = 0;
          local_2fc = 0;
          local_2f8 = 0;
          local_2f0 = 0;
          local_328 = 0;
          local_340 = 0.0;
          local_344 = 0.0;
          for (local_348 = 0; local_348 < local_2c8; local_348 = local_348 + 1) {
            local_340 = *(float *)(local_2e8 + (long)local_348 * 4) + local_340;
          }
          local_34c = local_340 / (float)local_2c8;
          local_350 = 0.0;
          for (local_354 = 0; local_354 < local_2c8; local_354 = local_354 + 1) {
            local_350 = *(float *)(local_2e8 + (long)local_354 * 4) - local_34c;
            local_344 = local_350 * local_350 + local_344;
          }
          local_358 = local_344 / (float)local_2c8;
          local_c8 = local_230;
          local_310 = local_90;
          dVar2 = std::sqrt((double)(ulong)(uint)(local_358 + *(float *)(in_RDI + 0xd4)));
          local_35c = 1.0 / SUB84(dVar2,0);
          local_360 = -local_34c * local_35c;
          if (*(int *)(in_RDI + 0xd8) == 0) {
            for (local_368 = 0; local_368 < local_2c8; local_368 = local_368 + 1) {
              *(float *)(local_2e8 + (long)local_368 * 4) =
                   *(float *)(local_2e8 + (long)local_368 * 4) * local_35c + local_360;
            }
          }
          else {
            for (local_364 = 0; local_364 < local_2c8; local_364 = local_364 + 1) {
              local_1c8 = (long *)(in_RDI + 0xe0);
              local_1d0 = (long)local_364;
              local_1d8 = (long *)(in_RDI + 0x128);
              local_1e0 = (long)local_364;
              *(float *)(local_2e8 + (long)local_364 * 4) =
                   (*(float *)(local_2e8 + (long)local_364 * 4) * local_35c + local_360) *
                   *(float *)(*local_1c8 + local_1d0 * 4) + *(float *)(*local_1d8 + local_1e0 * 4);
            }
          }
        }
      }
    }
    else {
      for (local_36c = 0; local_36c < local_2d0; local_36c = local_36c + 1) {
        local_150 = &local_3c0;
        local_2c = *(int *)((long)local_240 + 0x2c);
        local_30 = (int)local_240[6];
        local_34 = *(undefined4 *)((long)local_240 + 0x34);
        local_378 = *local_240 + local_240[8] * (long)local_36c * local_240[2];
        local_48 = local_240[2];
        local_4c = (undefined4)local_240[3];
        local_58 = local_240[4];
        local_28 = &local_3c0;
        local_18 = (long)local_2c * (long)local_30 * local_48;
        local_210 = &local_3c0;
        local_220 = &local_3c0;
        local_1c = 0x10;
        local_15c = local_36c;
        local_15d = 1;
        local_3c0 = 0;
        local_3b0 = 0;
        local_3a8 = 0;
        local_398 = 0;
        local_394 = 0;
        local_390 = 0;
        local_38c = 0;
        local_388 = 0;
        local_380 = 0;
        local_3b8 = 0;
        local_3c4 = 0.0;
        local_3c8 = 0.0;
        for (local_3cc = 0; local_3cc < local_2d4; local_3cc = local_3cc + 1) {
          local_3c4 = *(float *)(local_378 + (long)local_3cc * 4) + local_3c4;
        }
        fVar3 = (float)local_2d4;
        for (local_3d8 = 0; local_3d8 < local_2d4; local_3d8 = local_3d8 + 1) {
          fVar1 = *(float *)(local_378 + (long)local_3d8 * 4) - local_3c4 / fVar3;
          local_3c8 = fVar1 * fVar1 + local_3c8;
        }
        local_e8 = local_220;
        local_40 = local_378;
        local_3a0 = local_58;
        dVar2 = std::sqrt((double)(ulong)(uint)(local_3c8 / (float)local_2d4 +
                                               *(float *)(in_RDI + 0xd4)));
        fVar1 = 1.0 / SUB84(dVar2,0);
        fVar3 = -(local_3c4 / fVar3) * fVar1;
        if (*(int *)(in_RDI + 0xd8) == 0) {
          for (local_3ec = 0; local_3ec < local_2d4; local_3ec = local_3ec + 1) {
            *(float *)(local_378 + (long)local_3ec * 4) =
                 *(float *)(local_378 + (long)local_3ec * 4) * fVar1 + fVar3;
          }
        }
        else {
          for (local_3e8 = 0; local_3e8 < local_2d4; local_3e8 = local_3e8 + 1) {
            local_1e8 = (long *)(in_RDI + 0xe0);
            local_1f0 = (long)local_3e8;
            local_1f8 = (long *)(in_RDI + 0x128);
            local_200 = (long)local_3e8;
            *(float *)(local_378 + (long)local_3e8 * 4) =
                 (*(float *)(local_378 + (long)local_3e8 * 4) * fVar1 + fVar3) *
                 *(float *)(*local_1e8 + local_1f0 * 4) + *(float *)(*local_1f8 + local_200 * 4);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;
        // assert affine_size == w

        float* ptr = bottom_top_blob;

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < w; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / w;
        float tmp = 0.f;
        for (int i = 0; i < w; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / w;
        // the var maybe minus due to accuracy
        //float var = sqsum / w - mean * mean;

        float a = static_cast<float>(1.f / (sqrt(var + eps)));
        float b = -mean * a;

        if (affine)
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
            }
        }
        else
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sum += ptr[j];
                //sqsum += ptr[j] * ptr[j];
            }
            float mean = sum / w;
            float tmp = 0.f;
            for (int j = 0; j < w; j++)
            {
                tmp = ptr[j] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / w;
            // the var maybe minus due to accuracy
            //float var = sqsum / w - mean * mean;

            float a = static_cast<float>(1.f / (sqrt(var + eps)));
            float b = -mean * a;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a + b;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);

                    // mean and var
                    float sum = 0.f;
                    float sqsum = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        sum += ptr[j];
                        //sqsum += ptr[j] * ptr[j];
                    }
                    float mean = sum / w;
                    float tmp = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        tmp = ptr[j] - mean;
                        sqsum += tmp * tmp;
                    }
                    float var = sqsum / w;
                    // the var maybe minus due to accuracy
                    //float var = sqsum / w - mean * mean;

                    float a = static_cast<float>(1.f / (sqrt(var + eps)));
                    float b = -mean * a;

                    if (affine)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                        }
                    }
                    else
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = ptr[j] * a + b;
                        }
                    }
                }
            }
        }
        else // if (affine_size == size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                // mean and var
                float sum = 0.f;
                float sqsum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                    //sqsum += ptr[i] * ptr[i];
                }
                float mean = sum / size;
                float tmp = 0.f;
                for (int i = 0; i < size; i++)
                {
                    tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
                float var = sqsum / size;
                // the var maybe minus due to accuracy
                //float var = sqsum / size - mean * mean;

                float a = static_cast<float>(1.f / (sqrt(var + eps)));
                float b = -mean * a;

                if (affine)
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
                    }
                }
                else
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = ptr[i] * a + b;
                    }
                }
            }
        }
    }

    return 0;
}